

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

void __thiscall
embree::SceneGraph::PointSetNode::setMaterial
          (PointSetNode *this,Ref<embree::SceneGraph::MaterialNode> *material)

{
  MaterialNode *pMVar1;
  
  if (material->ptr != (MaterialNode *)0x0) {
    (*(material->ptr->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  pMVar1 = (this->material).ptr;
  if (pMVar1 != (MaterialNode *)0x0) {
    (*(pMVar1->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  (this->material).ptr = material->ptr;
  return;
}

Assistant:

virtual void setMaterial(Ref<MaterialNode> material) {
        this->material = material;
      }